

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

Aig_Man_t *
Saig_ManCexRefine(Aig_Man_t *p,Aig_Man_t *pAbs,Vec_Int_t *vFlops,int nFrames,int nConfMaxOne,
                 int fUseBdds,int fUseDprove,int fVerbose,int *pnUseStart,int *piRetValue,
                 int *pnFrames)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  Vec_Int_t *p_00;
  Abc_Cex_t *pAVar6;
  Pdr_Par_t Pars;
  
  *piRetValue = -1;
  if ((fUseDprove == 0) || (pAbs->nRegs < 1)) {
    if ((fUseBdds == 0) || (0x4f < pAbs->nRegs - 1U)) {
      if (pnUseStart == (int *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = *pnUseStart;
      }
      Saig_BmcPerform(pAbs,iVar2,nFrames,2000,0,nConfMaxOne,0,fVerbose,0,pnFrames,0,0);
      goto LAB_004f36b0;
    }
    Bbr_ManSetDefaultParams((Saig_ParBbr_t *)&Pars);
    Pars.nRecycle = 0;
    Pars.nFrameMax = 1000000;
    Pars.nConfGenLimit = 1;
    Pars.nRestLimit = 1;
    Pars.nTimeOut = 1;
    Pars.nTimeOutGap = fVerbose;
    Pars.nTimeOutOne = 0;
    Pars.nConfLimit = nFrames;
    iVar2 = Aig_ManVerifyUsingBdds(pAbs,(Saig_ParBbr_t *)&Pars);
  }
  else {
    pAVar5 = Saig_ManDupOrpos(pAbs);
    Pdr_ManSetDefaultParams(&Pars);
    Pars.nTimeOut = 10;
    Pars.fVerbose = fVerbose;
    if (fVerbose != 0) {
      puts("Running property directed reachability...");
    }
    iVar2 = Pdr_ManSolve(pAVar5,&Pars);
    if (pAVar5->pSeqModel == (Abc_Cex_t *)0x0) {
      pAVar6 = (Abc_Cex_t *)0x0;
    }
    else {
      iVar3 = Saig_ManFindFailedPoCex(pAbs,pAVar5->pSeqModel);
      pAVar6 = pAVar5->pSeqModel;
      pAVar6->iPo = iVar3;
    }
    pAbs->pSeqModel = pAVar6;
    pAVar5->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAVar5);
  }
  if (iVar2 != 0) {
    *piRetValue = 1;
  }
LAB_004f36b0:
  if (pAbs->pSeqModel != (Abc_Cex_t *)0x0) {
    if (pnUseStart != (int *)0x0) {
      *pnUseStart = pAbs->pSeqModel->iFrame;
    }
    iVar2 = Saig_ManCexFirstFlopPi(p,pAbs);
    p_00 = Saig_ManExtendCounterExampleTest3(pAbs,iVar2,pAbs->pSeqModel,fVerbose);
    if (p_00 != (Vec_Int_t *)0x0) {
      uVar1 = p_00->nSize;
      if (uVar1 != 0) {
        if (fVerbose != 0) {
          printf("Adding %d registers to the abstraction (total = %d).\n\n",(ulong)uVar1,
                 (ulong)(pAbs->nRegs + uVar1));
        }
        iVar2 = 0;
        while( true ) {
          if (p_00->nSize <= iVar2) {
            Vec_IntFree(p_00);
            qsort(vFlops->pArray,(long)vFlops->nSize,4,Vec_IntSortCompare1);
            iVar2 = 1;
            do {
              if (vFlops->nSize <= iVar2) {
                pAVar5 = Saig_ManDupAbstraction(p,vFlops);
                return pAVar5;
              }
              iVar3 = Vec_IntEntry(vFlops,iVar2);
              iVar4 = Vec_IntEntry(vFlops,iVar2 + -1);
              iVar2 = iVar2 + 1;
            } while (iVar4 != iVar3);
            __assert_fail("Vec_IntEntry(vFlops, i-1) != Entry",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldRef.c"
                          ,0xef,
                          "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                         );
          }
          iVar3 = Vec_IntEntry(p_00,iVar2);
          iVar3 = Vec_IntEntry(pAbs->vCiNumsOrig,iVar3);
          if (iVar3 < p->nTruePis) {
            __assert_fail("Entry >= Saig_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldRef.c"
                          ,0xe7,
                          "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                         );
          }
          if (p->nObjs[2] <= iVar3) break;
          Vec_IntPush(vFlops,iVar3 - p->nTruePis);
          iVar2 = iVar2 + 1;
        }
        __assert_fail("Entry < Aig_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldRef.c"
                      ,0xe8,
                      "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                     );
      }
      puts("Discovered a true counter-example!");
      pAVar6 = Saig_ManCexRemap(p,pAbs,pAbs->pSeqModel);
      p->pSeqModel = pAVar6;
      Vec_IntFree(p_00);
      *piRetValue = 0;
    }
  }
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManCexRefine( Aig_Man_t * p, Aig_Man_t * pAbs, Vec_Int_t * vFlops, int nFrames, int nConfMaxOne, int fUseBdds, int fUseDprove, int fVerbose, int * pnUseStart, int * piRetValue, int * pnFrames )
{ 
    Vec_Int_t * vFlopsNew;
    int i, Entry, RetValue;
    *piRetValue = -1;
    if ( fUseDprove && Aig_ManRegNum(pAbs) > 0 )
    {
/*
        Fra_Sec_t SecPar, * pSecPar = &SecPar;
        Fra_SecSetDefaultParams( pSecPar );
        pSecPar->fVerbose       = fVerbose;
        RetValue = Fra_FraigSec( pAbs, pSecPar, NULL );
*/
        Aig_Man_t * pAbsOrpos = Saig_ManDupOrpos( pAbs );
        Pdr_Par_t Pars, * pPars = &Pars;
        Pdr_ManSetDefaultParams( pPars );
        pPars->nTimeOut = 10;
        pPars->fVerbose = fVerbose;
        if ( pPars->fVerbose )
            printf( "Running property directed reachability...\n" );
        RetValue = Pdr_ManSolve( pAbsOrpos, pPars );
        if ( pAbsOrpos->pSeqModel )
            pAbsOrpos->pSeqModel->iPo = Saig_ManFindFailedPoCex( pAbs, pAbsOrpos->pSeqModel );
        pAbs->pSeqModel = pAbsOrpos->pSeqModel;
        pAbsOrpos->pSeqModel = NULL;
        Aig_ManStop( pAbsOrpos );
        if ( RetValue )
            *piRetValue = 1;

    }
    else if ( fUseBdds && (Aig_ManRegNum(pAbs) > 0 && Aig_ManRegNum(pAbs) <= 80) )
    {
        Saig_ParBbr_t Pars, * pPars = &Pars;
        Bbr_ManSetDefaultParams( pPars );
        pPars->TimeLimit     = 0;
        pPars->nBddMax       = 1000000;
        pPars->nIterMax      = nFrames;
        pPars->fPartition    = 1;
        pPars->fReorder      = 1;
        pPars->fReorderImage = 1;
        pPars->fVerbose      = fVerbose;
        pPars->fSilent       = 0;
        RetValue = Aig_ManVerifyUsingBdds( pAbs, pPars );
        if ( RetValue )
            *piRetValue = 1;
    }
    else 
    {
        Saig_BmcPerform( pAbs, pnUseStart? *pnUseStart: 0, nFrames, 2000, 0, nConfMaxOne, 0, fVerbose, 0, pnFrames, 0, 0 );
    }
    if ( pAbs->pSeqModel == NULL )
        return NULL;
    if ( pnUseStart )
        *pnUseStart = pAbs->pSeqModel->iFrame;
//    vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, 1, fVerbose );
    vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, fVerbose );
    if ( vFlopsNew == NULL )
        return NULL;
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Discovered a true counter-example!\n" );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pAbs->pSeqModel );
        Vec_IntFree( vFlopsNew );
        *piRetValue = 0;
        return NULL;
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    if ( fVerbose )
        printf( "Adding %d registers to the abstraction (total = %d).\n\n", Vec_IntSize(vFlopsNew), Aig_ManRegNum(pAbs)+Vec_IntSize(vFlopsNew) );
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );

    Vec_IntSort( vFlops, 0 );
    Vec_IntForEachEntryStart( vFlops, Entry, i, 1 )
        assert( Vec_IntEntry(vFlops, i-1) != Entry );

    return Saig_ManDupAbstraction( p, vFlops );
}